

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepro_prod.h
# Opt level: O0

FlatExpr * __thiscall
mp::
PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
::CombineOrderedFactors
          (PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
           *this)

{
  uint uVar1;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pPVar2;
  __tuple_element_t<2UL,_tuple<pair<int,_double>,_EExpr,_pair<double,_double>_>_> *p_Var3;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
  *fc;
  size_type sVar4;
  ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_00;
  PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
  *in_RSI;
  FlatExpr *in_RDI;
  bool is_lb_minus1;
  int binvar;
  Arguments args_forall;
  __tuple_element_t<2UL,_tuple<pair<int,_double>,_EExpr,_pair<double,_double>_>_> bnds;
  double coef00;
  int i;
  FlatExpr *result;
  EExpr *in_stack_fffffffffffff968;
  Constant in_stack_fffffffffffff970;
  value_type *in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  int in_stack_fffffffffffff984;
  int iVar5;
  double in_stack_fffffffffffff988;
  EExpr *in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff998;
  int in_stack_fffffffffffff99c;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
  *in_stack_fffffffffffff9a0;
  ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffff9b8;
  reference in_stack_fffffffffffff9c0;
  EExpr *in_stack_ffffffffffffff48;
  EExpr *in_stack_ffffffffffffff50;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffff58;
  int local_24;
  
  EExpr::EExpr(in_stack_fffffffffffff968,in_stack_fffffffffffff970);
  for (local_24 = 0; local_24 < in_RSI->n_terms_const_; local_24 = local_24 + 1) {
    gch::
    small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
    ::operator[]((small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
                  *)in_stack_fffffffffffff970.v,(size_type)in_stack_fffffffffffff968);
    std::get<2ul,std::pair<int,double>,mp::EExpr,std::pair<double,double>>
              ((tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_> *)0x3f04cc);
  }
  if (in_RSI->n_terms_binary_ == 2) {
    pPVar2 = &GetFlt(in_RSI)->
              super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ;
    uVar1 = ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::prepro_products(pPVar2);
    if ((uVar1 & 2) == 0) goto LAB_003f055b;
  }
  else {
LAB_003f055b:
    if (in_RSI->n_terms_binary_ < 3) goto LAB_003f0865;
    pPVar2 = &GetFlt(in_RSI)->
              super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ;
    uVar1 = ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::prepro_products(pPVar2);
    if ((uVar1 & 4) == 0) goto LAB_003f0865;
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3f05a3);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9a0,
             CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
  for (; local_24 < in_RSI->n_terms_const_ + in_RSI->n_terms_binary_; local_24 = local_24 + 1) {
    in_stack_fffffffffffff9b8 = GetFlt(in_RSI);
    in_stack_fffffffffffff9c0 =
         gch::
         small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
         ::operator[]((small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
                       *)in_stack_fffffffffffff970.v,(size_type)in_stack_fffffffffffff968);
    std::get<1ul,std::pair<int,double>,mp::EExpr,std::pair<double,double>>
              ((tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_> *)0x3f061f);
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::Convert2Var((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   *)in_stack_fffffffffffff970.v,in_stack_fffffffffffff968);
    gch::
    small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
    ::operator[]((small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
                  *)in_stack_fffffffffffff970.v,(size_type)in_stack_fffffffffffff968);
    p_Var3 = std::get<2ul,std::pair<int,double>,mp::EExpr,std::pair<double,double>>
                       ((tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_> *)
                        0x3f0667);
    if (p_Var3->first == -1.0) {
      in_stack_fffffffffffff9a0 =
           (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
            *)GetFlt(in_RSI);
      EExpr::EExpr(in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff984);
      in_stack_fffffffffffff99c =
           ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ::Convert2Var((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          *)in_stack_fffffffffffff970.v,in_stack_fffffffffffff968);
      EExpr::~EExpr((EExpr *)0x3f070f);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
               in_stack_fffffffffffff978);
  }
  fc = (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
        *)GetFlt(in_RSI);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9b8);
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
  ::CustomFunctionalConstraint
            (in_stack_fffffffffffff9a0,
             (Arguments *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::
  AssignResult2Args<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::AndId>>
            ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),fc);
  EExpr::operator=((EExpr *)in_stack_fffffffffffff970.v,in_stack_fffffffffffff968);
  EExpr::~EExpr((EExpr *)0x3f07fc);
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
  ::~CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AndId>
              *)in_stack_fffffffffffff970.v);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
LAB_003f0865:
  AlgebraicExpression<mp::QuadAndLinTerms>::operator*=
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)
             CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
             (double)in_stack_fffffffffffff978);
  while (iVar5 = local_24,
        sVar4 = gch::
                small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
                ::size((small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
                        *)0x3f0898), iVar5 < (int)sVar4) {
    this_00 = GetFlt(in_RSI);
    gch::
    small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
    ::operator[]((small_vector<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>,_32U,_std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>_>
                  *)this_00,(size_type)in_stack_fffffffffffff968);
    std::get<1ul,std::pair<int,double>,mp::EExpr,std::pair<double,double>>
              ((tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_> *)0x3f08e3);
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::QuadratizeOrLinearize
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    EExpr::operator=((EExpr *)this_00,in_stack_fffffffffffff968);
    EExpr::~EExpr((EExpr *)0x3f091e);
    local_24 = local_24 + 1;
  }
  return in_RDI;
}

Assistant:

FlatExpr CombineOrderedFactors() {
    FlatExpr result = typename FlatExpr::Constant {1.0};
    int i=0;
    double coef00 = 1.0;

    for ( ; i<n_terms_const_; ++i) {      // Collect constant factors
      // no: can have constant args
      // assert(std::get<1>(terms_flt_[i]).is_constant());
      auto bnds = std::get<2>(terms_flt_[i]);
      assert(bnds.first == bnds.second);
      coef00 *= bnds.first;
    }

    if ((n_terms_binary_==2 && GetFlt().prepro_products()&2) ||
        (n_terms_binary_>=3 && GetFlt().prepro_products()&4)) {
      AndConstraint::Arguments args_forall;
      args_forall.reserve(n_terms_binary_);   // Logicalize binary product
      for ( ; i<n_terms_const_+n_terms_binary_; ++i) {
        assert(1.0 ==                 // term bounds range 1
               std::get<2>(terms_flt_[i]).second -
                   std::get<2>(terms_flt_[i]).first );
        int binvar = GetFlt().Convert2Var(std::move(std::get<1>(terms_flt_[i])));
        auto is_lb_minus1 = (-1.0 == std::get<2>(terms_flt_[i]).first);
        if (is_lb_minus1) {    // negated binary
          coef00 *= -1;
          binvar = GetFlt().Convert2Var( { {-1.0}, {binvar} } );
        } else {
          assert(0.0 == std::get<2>(terms_flt_[i]).first); // normal binary
        }
        args_forall.push_back( binvar );
      }
      result = GetFlt().AssignResult2Args( AndConstraint{args_forall} );
      // Context should be set when adding the top contraint
    }

    result *= coef00;

    for ( ; i<(int)terms_flt_.size(); ++i) {
      result = GetFlt().QuadratizeOrLinearize(
          result, std::get<1>(terms_flt_[i]));
    }

    return result;
  }